

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_xattr.c
# Opt level: O1

int fwrite_xattr(CURL *curl,int fd)

{
  char *__value;
  int iVar1;
  int iVar2;
  size_t __size;
  long lVar3;
  char *__name;
  char *value;
  char *local_38;
  
  __name = "user.xdg.origin.url";
  lVar3 = 0;
  while( true ) {
    local_38 = (char *)0x0;
    iVar1 = curl_easy_getinfo(curl,*(undefined4 *)((long)&mappings[0].info + lVar3),&local_38);
    __value = local_38;
    iVar2 = 0;
    if (local_38 != (char *)0x0 && iVar1 == 0) {
      __size = strlen(local_38);
      iVar2 = fsetxattr(fd,__name,__value,__size,0);
    }
    if (iVar2 != 0) break;
    __name = *(char **)((long)&mappings[1].attr + lVar3);
    lVar3 = lVar3 + 0x10;
    if (lVar3 == 0x20) {
      return 0;
    }
  }
  return iVar2;
}

Assistant:

int fwrite_xattr(CURL *curl, int fd)
{
  int i = 0;
  int err = 0;

  /* loop through all xattr-curlinfo pairs and abort on a set error */
  while(err == 0 && mappings[i].attr != NULL) {
    char *value = NULL;
    CURLcode result = curl_easy_getinfo(curl, mappings[i].info, &value);
    if(!result && value) {
#ifdef HAVE_FSETXATTR_6
      err = fsetxattr(fd, mappings[i].attr, value, strlen(value), 0, 0);
#elif defined(HAVE_FSETXATTR_5)
      err = fsetxattr(fd, mappings[i].attr, value, strlen(value), 0);
#elif defined(__FreeBSD_version)
      err = extattr_set_fd(fd, EXTATTR_NAMESPACE_USER, mappings[i].attr, value,
                           strlen(value));
      /* FreeBSD's extattr_set_fd returns the length of the extended attribute
       */
      err = err < 0 ? err : 0;
#endif
    }
    i++;
  }

  return err;
}